

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

LY_ERR lysp_ext_find_definition
                 (ly_ctx *ctx,lysp_ext_instance *ext,lys_module **ext_mod,lysp_ext **ext_def)

{
  lysp_submodule *plVar1;
  int iVar2;
  lys_module *plVar3;
  lys_module *local_a8;
  ulong local_98;
  lys_module *local_88;
  lysp_submodule *submod;
  lys_module *mod;
  uint64_t v;
  uint64_t u;
  size_t name_len;
  size_t pref_len;
  char *prefix;
  char *name;
  char *tmp;
  lysp_ext **ext_def_local;
  lys_module **ext_mod_local;
  lysp_ext_instance *ext_local;
  ly_ctx *ctx_local;
  
  if (ext_def != (lysp_ext **)0x0) {
    *ext_def = (lysp_ext *)0x0;
  }
  name = ext->name;
  tmp = (char *)ext_def;
  ext_def_local = (lysp_ext **)ext_mod;
  ext_mod_local = (lys_module **)ext;
  ext_local = (lysp_ext_instance *)ctx;
  ly_parse_nodeid(&name,(char **)&pref_len,&name_len,&prefix,&u);
  plVar3 = ly_resolve_prefix((ly_ctx *)ext_local,(void *)pref_len,name_len,
                             *(LY_VALUE_FORMAT *)(ext_mod_local + 2),ext_mod_local[3]);
  *ext_def_local = (lysp_ext *)plVar3;
  if (plVar3 == (lys_module *)0x0) {
    ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_REFERENCE,
            "Invalid prefix \"%.*s\" used for extension instance identifier.",name_len & 0xffffffff,
            pref_len);
    ctx_local._4_4_ = LY_EVALID;
  }
  else if (tmp == (char *)0x0) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    mod = (lys_module *)0x0;
    while( true ) {
      if (plVar3->parsed->extensions == (lysp_ext *)0x0) {
        local_88 = (lys_module *)0x0;
      }
      else {
        local_88 = (lys_module *)plVar3->parsed->extensions[-1].compiled;
      }
      if (local_88 <= mod) goto LAB_001a40d2;
      iVar2 = strcmp(prefix,plVar3->parsed->extensions[(long)mod].name);
      if (iVar2 == 0) break;
      mod = (lys_module *)((long)&mod->ctx + 1);
    }
    *(lysp_ext **)tmp = plVar3->parsed->extensions + (long)mod;
LAB_001a40d2:
    if (*(long *)tmp == 0) {
      v = 0;
      while( true ) {
        if (plVar3->parsed->includes == (lysp_include *)0x0) {
          local_98 = 0;
        }
        else {
          local_98 = *(ulong *)(plVar3->parsed->includes[-1].rev + 8);
        }
        if (local_98 <= v) break;
        plVar1 = plVar3->parsed->includes[v].submodule;
        mod = (lys_module *)0x0;
        while( true ) {
          if (plVar1->extensions == (lysp_ext *)0x0) {
            local_a8 = (lys_module *)0x0;
          }
          else {
            local_a8 = (lys_module *)plVar1->extensions[-1].compiled;
          }
          if (local_a8 <= mod) goto LAB_001a41f6;
          iVar2 = strcmp(prefix,plVar1->extensions[(long)mod].name);
          if (iVar2 == 0) break;
          mod = (lys_module *)((long)&mod->ctx + 1);
        }
        *(lysp_ext **)tmp = plVar1->extensions + (long)mod;
LAB_001a41f6:
        v = v + 1;
      }
    }
    if (*(long *)tmp == 0) {
      ly_vlog((ly_ctx *)ext_local,(char *)0x0,LYVE_REFERENCE,
              "Extension definition of extension instance \"%s\" not found.",*ext_mod_local);
      ctx_local._4_4_ = LY_EVALID;
    }
    else {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lysp_ext_find_definition(const struct ly_ctx *ctx, const struct lysp_ext_instance *ext, const struct lys_module **ext_mod,
        struct lysp_ext **ext_def)
{
    const char *tmp, *name, *prefix;
    size_t pref_len, name_len;
    LY_ARRAY_COUNT_TYPE u, v;
    const struct lys_module *mod = NULL;
    const struct lysp_submodule *submod;

    if (ext_def) {
        *ext_def = NULL;
    }

    /* parse the prefix, the nodeid was previously already parsed and checked */
    tmp = ext->name;
    ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len);

    /* get module where the extension definition should be placed */
    *ext_mod = mod = ly_resolve_prefix(ctx, prefix, pref_len, ext->format, ext->prefix_data);
    if (!mod) {
        LOGVAL(ctx, LYVE_REFERENCE, "Invalid prefix \"%.*s\" used for extension instance identifier.", (int)pref_len, prefix);
        return LY_EVALID;
    }

    if (!ext_def) {
        /* we are done */
        return LY_SUCCESS;
    }

    /* find the parsed extension definition there */
    LY_ARRAY_FOR(mod->parsed->extensions, v) {
        if (!strcmp(name, mod->parsed->extensions[v].name)) {
            *ext_def = &mod->parsed->extensions[v];
            break;
        }
    }
    if (!*ext_def) {
        LY_ARRAY_FOR(mod->parsed->includes, u) {
            submod = mod->parsed->includes[u].submodule;
            LY_ARRAY_FOR(submod->extensions, v) {
                if (!strcmp(name, submod->extensions[v].name)) {
                    *ext_def = &submod->extensions[v];
                    break;
                }
            }
        }
    }

    if (!*ext_def) {
        LOGVAL(ctx, LYVE_REFERENCE, "Extension definition of extension instance \"%s\" not found.", ext->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}